

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O2

size_t __thiscall DObject::PropagateMark(DObject *this)

{
  PClass *this_00;
  size_t sVar1;
  size_t *psVar2;
  
  this_00 = GetClass(this);
  if (PClass::bShutdown == false) {
    psVar2 = this_00->FlatPointers;
    if (psVar2 == (size_t *)0x0) {
      PClass::BuildFlatPointers(this_00);
      psVar2 = this_00->FlatPointers;
    }
    for (; *psVar2 != 0xffffffffffffffff; psVar2 = psVar2 + 1) {
      GC::Mark((DObject **)((long)&this->_vptr_DObject + *psVar2));
    }
    sVar1 = (size_t)*(uint *)((long)&(this_00->super_PNativeStruct).super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
                             0x24);
  }
  else {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t DObject::PropagateMark()
{
	const PClass *info = GetClass();
	if (!PClass::bShutdown)
	{
		const size_t *offsets = info->FlatPointers;
		if (offsets == NULL)
		{
			const_cast<PClass *>(info)->BuildFlatPointers();
			offsets = info->FlatPointers;
		}
		while (*offsets != ~(size_t)0)
		{
			GC::Mark((DObject **)((BYTE *)this + *offsets));
			offsets++;
		}
		return info->Size;
	}
	return 0;
}